

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid_column_reader.hpp
# Opt level: O2

hugeint_t duckdb::UUIDValueConversion::ReadParquetUUID(const_data_ptr_t input)

{
  idx_t i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  hugeint_t hVar4;
  
  uVar3 = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    uVar3 = uVar3 << 8 | (ulong)input[lVar1];
  }
  uVar2 = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    uVar2 = uVar2 << 8 | (ulong)input[lVar1 + 8];
  }
  hVar4.upper = uVar3 ^ 0x8000000000000000;
  hVar4.lower = uVar2;
  return hVar4;
}

Assistant:

static hugeint_t ReadParquetUUID(const_data_ptr_t input) {
		hugeint_t result;
		result.lower = 0;
		uint64_t unsigned_upper = 0;
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			unsigned_upper <<= 8;
			unsigned_upper += input[i];
		}
		for (idx_t i = sizeof(uint64_t); i < sizeof(hugeint_t); i++) {
			result.lower <<= 8;
			result.lower += input[i];
		}
		result.upper = static_cast<int64_t>(unsigned_upper ^ (uint64_t(1) << 63));
		return result;
	}